

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O2

Statement * __thiscall
rsg::ConditionalStatement::createNextChild(ConditionalStatement *this,GeneratorState *state)

{
  bool bVar1;
  Statement *pSVar2;
  VariableType *type;
  Expression *pEVar3;
  ExpressionGenerator generator;
  ValueRange range;
  
  pSVar2 = this->m_trueStatement;
  if (this->m_falseStatement == (Statement *)0x0 && pSVar2 == (Statement *)0x0) {
    bVar1 = isElseBlockRequired(this,state);
    if (!bVar1) {
      bVar1 = de::Random::getBool(state->m_random);
      if (!bVar1) {
        pSVar2 = this->m_trueStatement;
        goto LAB_015dcd25;
      }
    }
    VariableManager::pushValueScope(state->m_varManager,&this->m_conditionalScope);
    pSVar2 = rsg::anon_unknown_0::createStatement(state);
    this->m_falseStatement = pSVar2;
  }
  else {
LAB_015dcd25:
    if (pSVar2 == (Statement *)0x0) {
      if (this->m_falseStatement != (Statement *)0x0) {
        VariableManager::popValueScope(state->m_varManager);
        ValueScope::clear(&this->m_conditionalScope);
      }
      VariableManager::pushValueScope(state->m_varManager,&this->m_conditionalScope);
      pSVar2 = rsg::anon_unknown_0::createStatement(state);
      this->m_trueStatement = pSVar2;
    }
    else {
      VariableManager::popValueScope(state->m_varManager);
      ValueScope::clear(&this->m_conditionalScope);
      ExpressionGenerator::ExpressionGenerator(&generator,state);
      type = VariableType::getScalarType(TYPE_BOOL);
      ValueRange::ValueRange(&range,type);
      if (range.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start ==
          range.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        range.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
      }
      (range.m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
       super__Vector_impl_data._M_start)->boolVal = false;
      if (range.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_start ==
          range.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        range.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
      }
      (range.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
       super__Vector_impl_data._M_start)->boolVal = true;
      pEVar3 = ExpressionGenerator::generate(&generator,&range,1);
      this->m_condition = pEVar3;
      ValueRange::~ValueRange(&range);
      ExpressionGenerator::~ExpressionGenerator(&generator);
      pSVar2 = (Statement *)0x0;
    }
  }
  return pSVar2;
}

Assistant:

Statement* ConditionalStatement::createNextChild (GeneratorState& state)
{
	// If has neither true or false statements, choose randomly whether to create false block.
	if (!m_falseStatement && !m_trueStatement && (isElseBlockRequired(state) || state.getRandom().getBool()))
	{
		// Construct false statement
		state.getVariableManager().pushValueScope(m_conditionalScope);
		m_falseStatement = createStatement(state);

		return m_falseStatement;
	}
	else if (!m_trueStatement)
	{
		if (m_falseStatement)
		{
			// Pop previous value scope.
			state.getVariableManager().popValueScope();
			m_conditionalScope.clear();
		}

		// Construct true statement
		state.getVariableManager().pushValueScope(m_conditionalScope);
		m_trueStatement = createStatement(state);

		return m_trueStatement;
	}
	else
	{
		// Pop conditional scope.
		state.getVariableManager().popValueScope();
		m_conditionalScope.clear();

		// Create condition
		DE_ASSERT(!m_condition);

		ExpressionGenerator generator(state);

		ValueRange range = ValueRange(VariableType::getScalarType(VariableType::TYPE_BOOL));
		range.getMin().asBool() = false;
		range.getMax().asBool() = true;

		m_condition = generator.generate(range, 1);

		return DE_NULL; // Done with this statement
	}
}